

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O2

void __thiscall
QTextStreamPrivate::putNumber(QTextStreamPrivate *this,qulonglong number,bool negative)

{
  QLocale *lhs;
  uint uVar1;
  int iVar2;
  bool bVar3;
  NumberOptions NVar4;
  QLocalePrivate *pQVar5;
  uint uVar6;
  undefined7 in_register_00000011;
  int base;
  uint uVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
          super_QFlagsStorage<QTextStream::NumberFlag>.i;
  uVar6 = (uVar1 & 1) * 0x80;
  uVar7 = uVar6 + 0x10;
  if ((int)CONCAT71(in_register_00000011,negative) != 0) {
    uVar7 = uVar6;
  }
  if ((uVar1 & 4) == 0) {
    uVar7 = uVar6;
  }
  uVar7 = (uVar1 & 8) * 0x20 + (uVar1 & 0x10) * 4 | uVar7;
  lhs = &this->locale;
  QLocale::c(&local_58,(void *)number);
  bVar3 = operator!=(lhs,(QLocale *)&local_58);
  if (bVar3) {
    NVar4 = QLocale::numberOptions(lhs);
    QLocale::~QLocale((QLocale *)&local_58);
    uVar7 = (((uint)NVar4.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                    super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | uVar7) ^ 0x20;
  }
  else {
    QLocale::~QLocale((QLocale *)&local_58);
  }
  pQVar5 = QSharedDataPointer<QLocalePrivate>::operator->(&lhs->d);
  iVar2 = (this->params).integerBase;
  base = 10;
  if (iVar2 != 0) {
    base = iVar2;
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLocaleData::unsLongLongToString((QString *)&local_58,pQVar5->m_data,number,-1,base,-1,uVar7);
  if (negative) {
    QLocale::negativeSign((QString *)&local_70,lhs);
    QString::prepend((QString *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  else if ((base == 8 && number == 0) &&
          (((this->params).numberFlags.super_QFlagsStorageHelper<QTextStream::NumberFlag,_4>.
            super_QFlagsStorage<QTextStream::NumberFlag>.i & 1) != 0)) {
    local_70.d = (Data *)0x149974;
    local_70.ptr = (char16_t *)0x1;
    bVar3 = operator==((QString *)&local_58,(QLatin1StringView *)&local_70);
    if (bVar3) {
      QString::prepend((QString *)&local_58,(QChar)0x30);
    }
  }
  putString(this,(QChar *)local_58.ptr,local_58.size,true);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putNumber(qulonglong number, bool negative)
{
    unsigned flags = 0;
    const QTextStream::NumberFlags numberFlags = params.numberFlags;
    if (numberFlags & QTextStream::ShowBase)
        flags |= QLocaleData::ShowBase;
    // ForceSign is irrelevant when we'll be including a sign in any case:
    if ((numberFlags & QTextStream::ForceSign) && !negative)
        flags |= QLocaleData::AlwaysShowSign;
    if (numberFlags & QTextStream::UppercaseBase)
        flags |= QLocaleData::UppercaseBase;
    if (numberFlags & QTextStream::UppercaseDigits)
        flags |= QLocaleData::CapitalEorX;

    // Group digits. For backward compatibility, we skip this for the C locale.
    if (locale != QLocale::c() && !locale.numberOptions().testFlag(QLocale::OmitGroupSeparator))
        flags |= QLocaleData::GroupDigits;

    const QLocaleData *dd = locale.d->m_data;
    int base = params.integerBase ? params.integerBase : 10;
    QString result = dd->unsLongLongToString(number, -1, base, -1, flags);
    if (negative) {
        result.prepend(locale.negativeSign());
    } else if (number == 0 && base == 8 && params.numberFlags & QTextStream::ShowBase
               && result == "0"_L1) {
        // Workaround for backward compatibility - in octal form with ShowBase
        // flag set, zero should get its 0 prefix before its 0 value, but
        // QLocalePrivate only adds the prefix if the number doesn't start with
        // a zero.
        result.prepend(u'0');
    }
    putString(result, true);
}